

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

VdbeCursor * allocateCursor(Vdbe *p,int iCur,int nField,int iDb,u8 eCurType)

{
  undefined1 *puVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  VdbeCursor *pVVar5;
  char *pcVar6;
  int iVar7;
  long lVar8;
  Mem *pMem;
  
  pMem = p->aMem;
  lVar8 = (long)iCur;
  if (0 < iCur) {
    pMem = pMem + (p->nMem - lVar8);
  }
  lVar2 = (long)nField * 8;
  lVar3 = lVar2 + 0x78;
  iVar7 = (int)lVar3 + 0x128;
  if (eCurType != '\0') {
    iVar7 = (int)lVar3;
  }
  if (p->apCsr[lVar8] != (VdbeCursor *)0x0) {
    puVar1 = &p->apCsr[lVar8]->field_0x5;
    *puVar1 = *puVar1 & 0xfe;
    sqlite3VdbeFreeCursor(p,p->apCsr[lVar8]);
    p->apCsr[lVar8] = (VdbeCursor *)0x0;
  }
  if (pMem->szMalloc < iVar7) {
    iVar7 = sqlite3VdbeMemGrow(pMem,iVar7,0);
    if (iVar7 != 0) {
      return (VdbeCursor *)0x0;
    }
  }
  else {
    pMem->z = pMem->zMalloc;
    pMem->flags = pMem->flags & 0xd;
  }
  pVVar5 = (VdbeCursor *)pMem->z;
  p->apCsr[lVar8] = pVVar5;
  pVVar5->eCurType = '\0';
  pVVar5->iDb = '\0';
  pVVar5->nullRow = '\0';
  pVVar5->deferredMoveto = '\0';
  pVVar5->isTable = '\0';
  *(undefined3 *)&pVVar5->field_0x5 = 0;
  pVVar5->pBtx = (Btree *)0x0;
  pVVar5->seqCount = 0;
  pVVar5->aAltMap = (int *)0x0;
  pVVar5->cacheStatus = 0;
  pVVar5->seekResult = 0;
  pVVar5->eCurType = eCurType;
  pVVar5->iDb = (i8)iDb;
  pVVar5->nField = (i16)nField;
  pVVar5->aOffset = pVVar5->aType + nField;
  if (eCurType == '\0') {
    pcVar6 = pMem->z;
    (pVVar5->uc).pCursor = (BtCursor *)(pcVar6 + lVar3);
    pcVar4 = pcVar6 + lVar2 + 0x88;
    pcVar4[0] = '\0';
    pcVar4[1] = '\0';
    pcVar4[2] = '\0';
    pcVar4[3] = '\0';
    pcVar4[4] = '\0';
    pcVar4[5] = '\0';
    pcVar4[6] = '\0';
    pcVar4[7] = '\0';
    pcVar4[8] = '\0';
    pcVar4[9] = '\0';
    pcVar4[10] = '\0';
    pcVar4[0xb] = '\0';
    pcVar4[0xc] = '\0';
    pcVar4[0xd] = '\0';
    pcVar4[0xe] = '\0';
    pcVar4[0xf] = '\0';
    pcVar6 = pcVar6 + lVar3;
    pcVar6[0] = '\0';
    pcVar6[1] = '\0';
    pcVar6[2] = '\0';
    pcVar6[3] = '\0';
    pcVar6[4] = '\0';
    pcVar6[5] = '\0';
    pcVar6[6] = '\0';
    pcVar6[7] = '\0';
    pcVar6[8] = '\0';
    pcVar6[9] = '\0';
    pcVar6[10] = '\0';
    pcVar6[0xb] = '\0';
    pcVar6[0xc] = '\0';
    pcVar6[0xd] = '\0';
    pcVar6[0xe] = '\0';
    pcVar6[0xf] = '\0';
  }
  return pVVar5;
}

Assistant:

static VdbeCursor *allocateCursor(
  Vdbe *p,              /* The virtual machine */
  int iCur,             /* Index of the new VdbeCursor */
  int nField,           /* Number of fields in the table or index */
  int iDb,              /* Database the cursor belongs to, or -1 */
  u8 eCurType           /* Type of the new cursor */
){
  /* Find the memory cell that will be used to store the blob of memory
  ** required for this VdbeCursor structure. It is convenient to use a 
  ** vdbe memory cell to manage the memory allocation required for a
  ** VdbeCursor structure for the following reasons:
  **
  **   * Sometimes cursor numbers are used for a couple of different
  **     purposes in a vdbe program. The different uses might require
  **     different sized allocations. Memory cells provide growable
  **     allocations.
  **
  **   * When using ENABLE_MEMORY_MANAGEMENT, memory cell buffers can
  **     be freed lazily via the sqlite3_release_memory() API. This
  **     minimizes the number of malloc calls made by the system.
  **
  ** The memory cell for cursor 0 is aMem[0]. The rest are allocated from
  ** the top of the register space.  Cursor 1 is at Mem[p->nMem-1].
  ** Cursor 2 is at Mem[p->nMem-2]. And so forth.
  */
  Mem *pMem = iCur>0 ? &p->aMem[p->nMem-iCur] : p->aMem;

  int nByte;
  VdbeCursor *pCx = 0;
  nByte = 
      ROUND8(sizeof(VdbeCursor)) + 2*sizeof(u32)*nField + 
      (eCurType==CURTYPE_BTREE?sqlite3BtreeCursorSize():0);

  assert( iCur>=0 && iCur<p->nCursor );
  if( p->apCsr[iCur] ){ /*OPTIMIZATION-IF-FALSE*/
    /* Before calling sqlite3VdbeFreeCursor(), ensure the isEphemeral flag
    ** is clear. Otherwise, if this is an ephemeral cursor created by 
    ** OP_OpenDup, the cursor will not be closed and will still be part
    ** of a BtShared.pCursor list.  */
    p->apCsr[iCur]->isEphemeral = 0;
    sqlite3VdbeFreeCursor(p, p->apCsr[iCur]);
    p->apCsr[iCur] = 0;
  }
  if( SQLITE_OK==sqlite3VdbeMemClearAndResize(pMem, nByte) ){
    p->apCsr[iCur] = pCx = (VdbeCursor*)pMem->z;
    memset(pCx, 0, offsetof(VdbeCursor,pAltCursor));
    pCx->eCurType = eCurType;
    pCx->iDb = iDb;
    pCx->nField = nField;
    pCx->aOffset = &pCx->aType[nField];
    if( eCurType==CURTYPE_BTREE ){
      pCx->uc.pCursor = (BtCursor*)
          &pMem->z[ROUND8(sizeof(VdbeCursor))+2*sizeof(u32)*nField];
      sqlite3BtreeCursorZero(pCx->uc.pCursor);
    }
  }
  return pCx;
}